

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::lookingAtLeadingWhitespace(SelectionCompiler *this)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  bool bVar3;
  int ichT;
  undefined4 local_c;
  
  local_c = *(int *)(in_RDI + 0xd8);
  while( true ) {
    bVar3 = false;
    if (local_c < *(int *)(in_RDI + 0xd0)) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
      iVar1 = isspace((int)*pcVar2);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    local_c = local_c + 1;
  }
  *(int *)(in_RDI + 0xdc) = local_c - *(int *)(in_RDI + 0xd8);
  return 0 < *(int *)(in_RDI + 0xdc);
}

Assistant:

bool SelectionCompiler::lookingAtLeadingWhitespace() {
    int ichT = ichToken;
    while (ichT < cchScript && std::isspace(script[ichT])) {
      ++ichT;
    }
    cchToken = ichT - ichToken;
    return cchToken > 0;
  }